

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CondResult.cpp
# Opt level: O2

void __thiscall oout::CondResult::CondResult(CondResult *this,bool cond,string *message)

{
  (this->super_Result)._vptr_Result = (_func_int **)&PTR__CondResult_00129860;
  this->cond = cond;
  std::__cxx11::string::string((string *)&this->message,(string *)message);
  return;
}

Assistant:

CondResult::CondResult(bool cond, const string &message)
	: cond(cond), message(message)
{
}